

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O1

int __thiscall
ORPG::ExpressionTree::parse_input_string
          (ExpressionTree *this,string *buff,int *numBytesRead,int maxBytesToRead)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (int)(this->inputString)._M_string_length - this->globalReadOffset;
  iVar1 = maxBytesToRead;
  if (iVar2 < maxBytesToRead) {
    iVar1 = iVar2;
  }
  buff->_M_string_length = 0;
  *(buff->_M_dataplus)._M_p = '\0';
  if (0 < iVar1) {
    if (maxBytesToRead < iVar2) {
      iVar2 = maxBytesToRead;
    }
    iVar3 = 0;
    do {
      std::__cxx11::string::push_back((char)buff);
      iVar3 = iVar3 + 1;
    } while (iVar2 != iVar3);
  }
  *numBytesRead = iVar1;
  this->globalReadOffset = this->globalReadOffset + iVar1;
  return 0;
}

Assistant:

int ExpressionTree::parse_input_string(string* buff, int* numBytesRead, int maxBytesToRead) {
        int numBytesToRead = maxBytesToRead;
        int bytesRemaining = inputString.length() - globalReadOffset;
        
        if(numBytesToRead > bytesRemaining) { numBytesToRead = bytesRemaining; }

        buff->clear();

        for(int i = 0; i < numBytesToRead; i++)
            buff->push_back(inputString[i + globalReadOffset]);
        
        *numBytesRead = numBytesToRead;
        globalReadOffset += numBytesToRead;
        
        return 0;
    }